

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceDirWrapper.cpp
# Opt level: O1

QString * __thiscall
ResourceDirWrapper::getFieldName
          (QString *__return_storage_ptr__,ResourceDirWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  PEFile *this_00;
  storage_type *psVar2;
  QByteArrayView QVar3;
  Data *local_28;
  char16_t *local_20;
  qsizetype local_18;
  
  switch(fieldId) {
  case 0:
    psVar2 = (storage_type *)0xf;
    break;
  case 1:
    pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    if (pEVar1 == (Executable *)0x0) {
      this_00 = (PEFile *)0x0;
    }
    else {
      this_00 = (PEFile *)__dynamic_cast(pEVar1,&Executable::typeinfo,&PEFile::typeinfo,0);
    }
    if (this_00 != (PEFile *)0x0) {
      PEFile::isReproBuild(this_00);
    }
    psVar2 = (storage_type *)0xd;
    break;
  case 2:
    goto LAB_00138ace;
  case 3:
LAB_00138ace:
    psVar2 = (storage_type *)0xc;
    break;
  case 4:
    psVar2 = (storage_type *)0x14;
    break;
  case 5:
    psVar2 = (storage_type *)0x11;
    break;
  default:
    (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  QVar3.m_data = psVar2;
  QVar3.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar3);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = local_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString ResourceDirWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case CHARACTERISTIC: return "Characteristics";
        case TIMESTAMP: {
            PEFile* myPe = dynamic_cast<PEFile*>(this->m_Exe);
            if (myPe && myPe->isReproBuild()) {
                return "ReproChecksum";
            }
            return "TimeDateStamp";
        }
        case MAJOR_VER: return "MajorVersion";
        case MINOR_VER: return "MinorVersion";
        case NAMED_ENTRIES_NUM : return "NumberOfNamedEntries";
        case ID_ENTRIES_NUM : return "NumberOfIdEntries";
    }
    return getName();
}